

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::MarkOrCopy(FlowBuffer *this)

{
  uint8 uVar1;
  LineBreakStyle LVar2;
  int iVar3;
  anon_enum_32 aVar4;
  long lVar5;
  int len;
  int iVar6;
  const_byteptr puVar7;
  anon_enum_32 aVar8;
  const_byteptr puVar9;
  
  if (this->message_complete_ == false) {
    if (this->mode_ == FRAME_MODE) {
      if (((this->mode_ == FRAME_MODE) && (this->state_ == CR_OR_LF_1)) &&
         (puVar7 = this->orig_data_begin_, puVar7 < this->orig_data_end_)) {
        if (*puVar7 == '\n') {
          this->orig_data_begin_ = puVar7 + 1;
        }
        this->state_ = FRAME_0;
      }
      iVar6 = this->buffer_n_;
      if (iVar6 == 0) {
        if (((long)this->frame_length_ < 0) ||
           ((long)this->orig_data_end_ - (long)this->orig_data_begin_ < (long)this->frame_length_))
        {
          if (this->chunked_ == false) {
            AppendToBuffer(this,this->orig_data_begin_,
                           *(int *)&this->orig_data_end_ - (int)this->orig_data_begin_);
          }
          this->message_complete_ = false;
        }
        else {
          this->message_complete_ = true;
        }
        return;
      }
      len = *(int *)&this->orig_data_end_ - (int)this->orig_data_begin_;
      this->message_complete_ = false;
      iVar3 = this->frame_length_;
      if ((-1 < iVar3) && (iVar3 <= iVar6 + len)) {
        len = iVar3 - iVar6;
        this->message_complete_ = true;
      }
      AppendToBuffer(this,this->orig_data_begin_,len);
      return;
    }
    if (this->mode_ == CR_OR_LF_1) {
      LVar2 = this->linebreak_style_;
      if (LVar2 == LINE_BREAKER) {
        puVar7 = this->orig_data_begin_;
        if ((puVar7 != (const_byteptr)0x0) &&
           (puVar9 = this->orig_data_end_, puVar9 != (const_byteptr)0x0)) {
          lVar5 = 0;
          while( true ) {
            if (puVar9 <= puVar7 + lVar5) {
              AppendToBuffer(this,puVar7,(int)puVar9 - (int)puVar7);
              return;
            }
            if (puVar7[lVar5] == this->linebreaker_) break;
            lVar5 = lVar5 + 1;
          }
          if (this->buffer_n_ == 0) {
            this->frame_length_ = (int)lVar5;
          }
          else {
            AppendToBuffer(this,puVar7,(int)lVar5 + 1);
            this->buffer_n_ = this->buffer_n_ + -1;
          }
          this->message_complete_ = true;
        }
        return;
      }
      if (LVar2 == STRICT_CRLF) {
        puVar7 = this->orig_data_begin_;
        aVar8 = this->state_;
        iVar6 = -1;
        puVar9 = puVar7;
        do {
          if (this->orig_data_end_ <= puVar9) {
            AppendToBuffer(this,puVar7,(int)this->orig_data_end_ - (int)puVar7);
            return;
          }
          aVar4 = STRICT_CRLF_1;
          if (*puVar9 == '\r') {
LAB_0010294b:
            aVar8 = aVar4;
            this->state_ = aVar8;
          }
          else {
            if (*puVar9 != '\n') {
              aVar4 = FRAME_MODE;
              goto LAB_0010294b;
            }
            if (aVar8 == STRICT_CRLF_1) {
              this->state_ = FRAME_MODE;
              if (this->buffer_n_ == 0) {
                this->frame_length_ = iVar6;
              }
              else {
                AppendToBuffer(this,puVar7,iVar6 + 2);
                this->buffer_n_ = this->buffer_n_ + -2;
              }
              this->message_complete_ = true;
              return;
            }
          }
          puVar9 = puVar9 + 1;
          iVar6 = iVar6 + 1;
        } while( true );
      }
      if (LVar2 != CR_OR_LF) {
        return;
      }
      puVar7 = this->orig_data_begin_;
      if ((puVar7 != (const_byteptr)0x0) &&
         (puVar9 = this->orig_data_end_, puVar9 != (const_byteptr)0x0)) {
        if ((puVar7 < puVar9) && ((this->state_ == CR_OR_LF_1 && (*puVar7 == '\n')))) {
          this->state_ = CR_OR_LF_0;
          puVar7 = puVar7 + 1;
          this->orig_data_begin_ = puVar7;
        }
        lVar5 = 0;
        while( true ) {
          if (puVar9 <= puVar7 + lVar5) {
            AppendToBuffer(this,puVar7,(int)puVar9 - (int)puVar7);
            return;
          }
          uVar1 = puVar7[lVar5];
          if (uVar1 == '\n') break;
          if (uVar1 == '\r') {
            this->state_ = CR_OR_LF_1;
            break;
          }
          lVar5 = lVar5 + 1;
        }
        if (this->buffer_n_ == 0) {
          this->frame_length_ = (int)lVar5;
        }
        else {
          AppendToBuffer(this,puVar7,(int)lVar5 + 1);
          this->buffer_n_ = this->buffer_n_ + -1;
        }
        this->message_complete_ = true;
      }
      return;
    }
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopy()
	{
	if ( ! message_complete_ )
		{
		switch ( mode_ )
			{
			case LINE_MODE:
				MarkOrCopyLine();
				break;

			case FRAME_MODE:
				MarkOrCopyFrame();
				break;

			default:
				break;
			}
		}
	}